

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void handleDefaultArguments(QList<FunctionDef> *functionList,FunctionDef *function)

{
  qsizetype qVar1;
  ArgumentDef *pAVar2;
  QList<FunctionDef> *in_RSI;
  uint7 in_stack_ffffffffffffffe8;
  byte bVar3;
  
  while( true ) {
    qVar1 = QList<ArgumentDef>::size((QList<ArgumentDef> *)&in_RSI[2].d.size);
    bVar3 = 0;
    if (0 < qVar1) {
      pAVar2 = QList<ArgumentDef>::constLast((QList<ArgumentDef> *)(ulong)in_stack_ffffffffffffffe8)
      ;
      bVar3 = pAVar2->isDefault;
    }
    if ((bVar3 & 1) == 0) break;
    *(undefined1 *)((long)&in_RSI[8].d.d + 4) = 1;
    QList<ArgumentDef>::removeLast((QList<ArgumentDef> *)in_RSI);
    QList<FunctionDef>::operator+=(in_RSI,(parameter_type)CONCAT17(bVar3,in_stack_ffffffffffffffe8))
    ;
  }
  return;
}

Assistant:

inline void handleDefaultArguments(QList<FunctionDef> *functionList, FunctionDef &function)
{
    // support a function with a default argument by pretending there is an
    // overload without the argument (the original function is the overload with
    // all arguments present)
    while (function.arguments.size() > 0 && function.arguments.constLast().isDefault) {
        function.wasCloned = true;
        function.arguments.removeLast();
        *functionList += function;
    }
}